

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListReader * __thiscall
capnp::_::OrphanBuilder::asListReader
          (ListReader *__return_storage_ptr__,OrphanBuilder *this,ElementSize elementSize)

{
  SegmentBuilder *segment;
  CapTableReader *capTable;
  word *refTarget;
  undefined1 expectedElementSize;
  bool bVar1;
  int nestingLimit;
  WirePointer *pWVar2;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<bool,_bool> _kjCondition;
  ElementSize elementSize_local;
  OrphanBuilder *this_local;
  
  _kjCondition._31_1_ = elementSize;
  pWVar2 = tagAsPtr(this);
  f.exception._6_1_ = WirePointer::isNull(pWVar2);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  f.exception._5_1_ = this->location == (word *)0x0;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_38,
             (DebugExpression<bool> *)((long)&f.exception + 7),(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe43,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","_kjCondition,",
               (DebugComparison<bool,_bool> *)local_38);
    kj::_::Debug::Fault::fatal(&local_48);
  }
  segment = this->segment;
  capTable = &this->capTable->super_CapTableReader;
  pWVar2 = tagAsPtr(this);
  expectedElementSize = _kjCondition._31_1_;
  refTarget = this->location;
  nestingLimit = kj::MaxValue_::operator_cast_to_int((MaxValue_ *)&kj::maxValue);
  WireHelpers::readListPointer
            (__return_storage_ptr__,&segment->super_SegmentReader,capTable,pWVar2,refTarget,
             (word *)0x0,expectedElementSize,nestingLimit,true);
  return __return_storage_ptr__;
}

Assistant:

ListReader OrphanBuilder::asListReader(ElementSize elementSize) const {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));
  return WireHelpers::readListPointer(
      segment, capTable, tagAsPtr(), location, nullptr, elementSize, kj::maxValue);
}